

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O1

void __thiscall
TEST_SimpleString_MaskedBits32Bit_Test::TEST_SimpleString_MaskedBits32Bit_Test
          (TEST_SimpleString_MaskedBits32Bit_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.free_name_ = (char *)0x0;
  *(undefined8 *)
   &(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
    super_TestMemoryAllocator.hasBeenDestroyed_ = 0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator.alloc_name_ = (char *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator._vptr_TestMemoryAllocator = (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).stash.originalAllocator_ =
       (TestMemoryAllocator *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00364e78;
  TestMemoryAllocator::TestMemoryAllocator
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator
              .super_TestMemoryAllocator,"generic","alloc","free");
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).justNewForSimpleStringTestAllocator.
  super_TestMemoryAllocator._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00364eb8;
  GlobalSimpleStringAllocatorStash::GlobalSimpleStringAllocatorStash
            (&(this->super_TEST_GROUP_CppUTestGroupSimpleString).stash);
  (this->super_TEST_GROUP_CppUTestGroupSimpleString).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupSimpleString_00363e40;
  return;
}

Assistant:

TEST(SimpleString, MaskedBits32Bit)
{
    STRCMP_EQUAL("xxxxxxxx xxxxxxxx xxxxxxxx xxxxxxxx", StringFromMaskedBits(0x00000000, 0x00000000, 4*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("00000000 00000000 00000000 00000000", StringFromMaskedBits(0x00000000, 0xFFFFFFFF, 4*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11111111 11111111 11111111 11111111", StringFromMaskedBits(0xFFFFFFFF, 0xFFFFFFFF, 4*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("1xxxxxxx xxxxxxxx xxxxxxxx xxxxxxxx", StringFromMaskedBits(0x80000000, 0x80000000, 4*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("xxxxxxxx xxxxxxxx xxxxxxxx xxxxxxx1", StringFromMaskedBits(0x00000001, 0x00000001, 4*8/CPPUTEST_CHAR_BIT).asCharString());
    STRCMP_EQUAL("11xx11xx 11xx11xx 11xx11xx 11xx11xx", StringFromMaskedBits(0xFFFFFFFF, 0xCCCCCCCC, 4*8/CPPUTEST_CHAR_BIT).asCharString());
}